

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O3

unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>
__thiscall anon_unknown.dwarf_1c0a25::MkdirTool::createCommand(MkdirTool *this,StringRef name)

{
  _func_int **pp_Var1;
  long in_RCX;
  size_t sVar2;
  
  sVar2 = name.Length;
  pp_Var1 = (_func_int **)operator_new(0x138);
  *pp_Var1 = (_func_int *)&PTR__Command_002509a0;
  pp_Var1[1] = (_func_int *)(pp_Var1 + 3);
  if (sVar2 == 0) {
    pp_Var1[2] = (_func_int *)0x0;
    *(undefined1 *)(pp_Var1 + 3) = 0;
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)(pp_Var1 + 1),sVar2,in_RCX + sVar2);
  }
  pp_Var1[9] = (_func_int *)0x0;
  pp_Var1[10] = (_func_int *)0x0;
  pp_Var1[7] = (_func_int *)0x0;
  pp_Var1[8] = (_func_int *)0x0;
  pp_Var1[5] = (_func_int *)0x0;
  pp_Var1[6] = (_func_int *)0x0;
  *(undefined1 *)(pp_Var1 + 0xb) = 0;
  pp_Var1[0xc] = (_func_int *)(pp_Var1 + 0xe);
  pp_Var1[0xd] = (_func_int *)0x0;
  *(undefined1 *)(pp_Var1 + 0xe) = 0;
  *(undefined2 *)(pp_Var1 + 0x10) = 0;
  *(undefined1 *)((long)pp_Var1 + 0x82) = 0;
  *(undefined1 *)(pp_Var1 + 0x1f) = 0;
  pp_Var1[0x20] = (_func_int *)(pp_Var1 + 0x22);
  pp_Var1[0x21] = (_func_int *)0x100000000;
  *(undefined2 *)(pp_Var1 + 0x26) = 1;
  *pp_Var1 = (_func_int *)&PTR__ExternalCommand_0024f890;
  (this->super_Tool)._vptr_Tool = pp_Var1;
  return (__uniq_ptr_data<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>,_true,_true>
          )(__uniq_ptr_data<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>,_true,_true>
            )this;
}

Assistant:

virtual std::unique_ptr<Command> createCommand(StringRef name) override {
    auto res = llvm::make_unique<MkdirCommand>(name);
    return res;
  }